

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

void __thiscall Memory::HeapInfo::Verify(HeapInfo *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar5;
  SmallFinalizableHeapBlock *this_00;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar6;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_01;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_9;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  long lVar7;
  
  BVar3 = Recycler::CollectionInProgress(this->recycler);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x741,"(!this->recycler->CollectionInProgress())",
                       "!this->recycler->CollectionInProgress()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  for (lVar7 = 0x78; lVar7 != 0xa878; lVar7 = lVar7 + 0x380) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::Verify
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar7));
  }
  for (lVar7 = 0; lVar7 != 0x6580; lVar7 = lVar7 + 0x380) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::Verify
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&this->mediumHeapBuckets[0].heapBucket.
                       super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .
                       super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar7));
  }
  LargeHeapBucket::Verify(&this->largeObjectBucket);
  for (pSVar5 = &this->newLeafHeapBlockList->super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
      pSVar5 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar5 = &SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                          ((SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)pSVar5)->
                super_SmallHeapBlockT<SmallAllocationBlockAttributes>) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::Verify(pSVar5,false);
  }
  for (pSVar5 = &this->newNormalHeapBlockList->super_SmallHeapBlockT<SmallAllocationBlockAttributes>
      ; pSVar5 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar5 = &SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                          ((SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)pSVar5)->
                super_SmallHeapBlockT<SmallAllocationBlockAttributes>) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::Verify(pSVar5,false);
  }
  for (pSVar5 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                this->newNormalWithBarrierHeapBlockList;
      pSVar5 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar5 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
               SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                         ((SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)pSVar5
                         )) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::Verify(pSVar5,false);
  }
  for (pSVar5 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                this->newFinalizableWithBarrierHeapBlockList;
      pSVar5 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar5 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
               SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                         ((SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
                          pSVar5)) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::Verify(pSVar5,false);
  }
  for (this_00 = this->newFinalizableHeapBlockList;
      this_00 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      this_00 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(this_00)) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::Verify
              ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this_00,false);
  }
  for (pSVar6 = &this->newMediumLeafHeapBlockList->
                 super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
      pSVar6 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar6 = &SmallLeafHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                          ((SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)pSVar6)->
                super_SmallHeapBlockT<MediumAllocationBlockAttributes>) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(pSVar6,false);
  }
  for (pSVar6 = &this->newMediumNormalHeapBlockList->
                 super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
      pSVar6 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar6 = &SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                          ((SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)pSVar6)->
                super_SmallHeapBlockT<MediumAllocationBlockAttributes>) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(pSVar6,false);
  }
  for (pSVar6 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                this->newMediumNormalWithBarrierHeapBlockList;
      pSVar6 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar6 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
               SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                         ((SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                          pSVar6)) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(pSVar6,false);
  }
  for (pSVar6 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                this->newMediumFinalizableWithBarrierHeapBlockList;
      pSVar6 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar6 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
               SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                         ((SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                          pSVar6)) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(pSVar6,false);
  }
  for (this_01 = this->newMediumFinalizableHeapBlockList;
      this_01 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      this_01 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(this_01))
  {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify
              ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this_01,false);
  }
  return;
}

Assistant:

void
HeapInfo::Verify()
{
    Assert(!this->recycler->CollectionInProgress());
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].Verify();
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].Verify();
    }
#endif

    largeObjectBucket.Verify();

#if ENABLE_CONCURRENT_GC
    HeapBlockList::ForEach(newLeafHeapBlockList, [](SmallLeafHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
    HeapBlockList::ForEach(newNormalHeapBlockList, [](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [](SmallNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
    HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [](SmallFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
#ifdef RECYCLER_VISITED_HOST
    HeapBlockList::ForEach(newRecyclerVisitedHostHeapBlockList, [](SmallFinalizableHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
    HeapBlockList::ForEach(newFinalizableHeapBlockList, [](SmallFinalizableHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif

#if ENABLE_CONCURRENT_GC
    HeapBlockList::ForEach(newMediumLeafHeapBlockList, [](MediumLeafHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
    HeapBlockList::ForEach(newMediumNormalHeapBlockList, [](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [](MediumNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
    HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [](MediumFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
#ifdef RECYCLER_VISITED_HOST
    HeapBlockList::ForEach(newMediumRecyclerVisitedHostHeapBlockList, [](MediumFinalizableHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
    HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [](MediumFinalizableHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
}